

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  undefined8 uVar1;
  ushort uVar2;
  ushort uVar3;
  mz_zip_internal_state *pmVar4;
  void *pvVar5;
  void *pvVar6;
  mz_bool mVar7;
  time_t tVar8;
  ulong uVar9;
  uint uVar10;
  tm local_68;
  
  mVar7 = 0;
  if ((((pZip != (mz_zip_archive *)0x0) &&
       (pmVar4 = pZip->m_pState, pmVar4 != (mz_zip_internal_state *)0x0)) &&
      (file_index < pZip->m_total_files)) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) {
    pvVar5 = (pmVar4->m_central_dir).m_p;
    if (pStat != (mz_zip_archive_file_stat *)0x0 && pvVar5 != (void *)0x0) {
      pvVar6 = (pmVar4->m_central_dir_offsets).m_p;
      uVar9 = (ulong)*(uint *)((long)pvVar6 + (ulong)file_index * 4);
      pStat->m_file_index = file_index;
      pStat->m_central_dir_ofs = *(mz_uint32 *)((long)pvVar6 + (ulong)file_index * 4);
      pvVar6 = (void *)((long)pvVar5 + uVar9 + 0x2e);
      pStat->m_version_made_by = *(mz_uint16 *)((long)pvVar6 + -0x2a);
      pStat->m_version_needed = *(mz_uint16 *)((long)pvVar6 + -0x28);
      pStat->m_bit_flag = *(mz_uint16 *)((long)pvVar6 + -0x26);
      pStat->m_method = *(mz_uint16 *)((long)pvVar6 + -0x24);
      uVar2 = *(ushort *)((long)pvVar6 + -0x22);
      uVar3 = *(ushort *)((long)pvVar6 + -0x20);
      local_68.tm_wday = 0;
      local_68.tm_yday = 0;
      local_68.tm_gmtoff = 0;
      local_68.tm_zone = (char *)0x0;
      local_68.tm_isdst = -1;
      local_68._36_4_ = 0;
      local_68.tm_year = (uVar3 >> 9) + 0x50;
      local_68.tm_mon = (uVar3 >> 5 & 0xf) - 1;
      local_68.tm_mday = uVar3 & 0x1f;
      local_68.tm_hour = (int)(uVar2 >> 0xb);
      local_68.tm_min = uVar2 >> 5 & 0x3f;
      local_68.tm_sec = (uint)uVar2 * 2 & 0x3e;
      tVar8 = mktime(&local_68);
      pStat->m_time = tVar8;
      pStat->m_crc32 = *(mz_uint32 *)((long)pvVar6 + -0x1e);
      uVar1 = *(undefined8 *)((long)pvVar6 + -0x1a);
      *(int *)&pStat->m_comp_size = (int)uVar1;
      *(undefined4 *)((long)&pStat->m_comp_size + 4) = 0;
      *(int *)&pStat->m_uncomp_size = (int)((ulong)uVar1 >> 0x20);
      *(undefined4 *)((long)&pStat->m_uncomp_size + 4) = 0;
      pStat->m_internal_attr = *(mz_uint16 *)((long)pvVar6 + -10);
      pStat->m_external_attr = *(mz_uint32 *)((long)pvVar6 + -8);
      pStat->m_local_header_ofs = (ulong)*(uint *)((long)pvVar6 + -4);
      uVar10 = 0x103;
      if (*(ushort *)((long)pvVar6 + -0x12) < 0x103) {
        uVar10 = (uint)*(ushort *)((long)pvVar6 + -0x12);
      }
      __wrap_memcpy(pStat->m_filename,pvVar6,(ulong)uVar10);
      pStat->m_filename[uVar10] = '\0';
      uVar10 = 0xff;
      if (*(ushort *)((long)pvVar6 + -0xe) < 0xff) {
        uVar10 = (uint)*(ushort *)((long)pvVar6 + -0xe);
      }
      pStat->m_comment_size = uVar10;
      __wrap_memcpy(pStat->m_comment,
                    (void *)((long)pvVar5 +
                            (ulong)*(ushort *)((long)pvVar6 + -0x10) +
                            *(ushort *)((long)pvVar6 + -0x12) + uVar9 + 0x2e),(ulong)uVar10);
      pStat->m_comment[uVar10] = '\0';
      mVar7 = 1;
    }
  }
  return mVar7;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index, mz_zip_archive_file_stat *pStat)
{
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if ((!p) || (!pStat))
    return MZ_FALSE;

  // Unpack the central directory record.
  pStat->m_file_index = file_index;
  pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
  pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
  pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
  pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
  pStat->m_time = mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS), MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
  pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
  pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
  pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
  pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

  // Copy as much of the filename and comment as possible.
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS); n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
  memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n); pStat->m_filename[n] = '\0';

  n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS); n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
  pStat->m_comment_size = n;
  memcpy(pStat->m_comment, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS), n); pStat->m_comment[n] = '\0';

  return MZ_TRUE;
}